

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O0

int Extra_ProfileWidth(DdManager *dd,DdNode *Func,int *pProfile,int CutLevel)

{
  int iVar1;
  int local_74;
  int local_6c;
  int local_64;
  int local_60;
  int WidthMax;
  int size;
  int i;
  int Limit;
  int LevelStart;
  DdNode *nodeR;
  DdNode *node;
  st__table *tNodes;
  st__table *tNodeTopRef;
  st__generator *gen;
  int *piStack_20;
  int CutLevel_local;
  int *pProfile_local;
  DdNode *Func_local;
  DdManager *dd_local;
  
  gen._4_4_ = CutLevel;
  piStack_20 = pProfile;
  pProfile_local = (int *)Func;
  Func_local = &dd->sentinel;
  tNodes = st__init_table(st__ptrcmp,st__ptrhash);
  extraProfileUpdateTopLevel(tNodes,0,(DdNode *)pProfile_local);
  node = (DdNode *)Extra_CollectNodes((DdNode *)pProfile_local);
  tNodeTopRef = (st__table *)st__init_gen((st__table *)node);
  while (iVar1 = st__gen((st__generator *)tNodeTopRef,(char **)&nodeR,(char **)0x0), iVar1 != 0) {
    _Limit = (uint *)((ulong)nodeR & 0xfffffffffffffffe);
    if (*_Limit != 0x7fffffff) {
      extraProfileUpdateTopLevel
                (tNodes,*(int *)(Func_local[7].Id + (ulong)nodeR->index * 4) + 1,
                 *(DdNode **)(_Limit + 6));
      extraProfileUpdateTopLevel
                (tNodes,*(int *)(Func_local[7].Id + (ulong)nodeR->index * 4) + 1,
                 *(DdNode **)(_Limit + 4));
    }
  }
  st__free_gen((st__generator *)tNodeTopRef);
  st__free_table((st__table *)node);
  if (*(int *)&Func_local[3].type < *(int *)((long)&Func_local[3].type + 4)) {
    local_6c = *(int *)((long)&Func_local[3].type + 4);
  }
  else {
    local_6c = *(int *)&Func_local[3].type;
  }
  local_60 = local_6c + 1;
  for (WidthMax = 0; WidthMax < local_60; WidthMax = WidthMax + 1) {
    piStack_20[WidthMax] = 0;
  }
  tNodeTopRef = (st__table *)st__init_gen(tNodes);
  while (iVar1 = st__gen((st__generator *)tNodeTopRef,(char **)&nodeR,(char **)&i), iVar1 != 0) {
    _Limit = (uint *)((ulong)nodeR & 0xfffffffffffffffe);
    if (*_Limit == 0x7fffffff) {
      local_74 = *(int *)&Func_local[3].type;
    }
    else {
      local_74 = *(int *)(Func_local[7].Id + (ulong)*_Limit * 4);
    }
    for (WidthMax = i; WidthMax <= local_74; WidthMax = WidthMax + 1) {
      piStack_20[WidthMax] = piStack_20[WidthMax] + 1;
    }
  }
  st__free_gen((st__generator *)tNodeTopRef);
  if ((gen._4_4_ != -1) && (gen._4_4_ != 0)) {
    local_60 = gen._4_4_;
  }
  local_64 = 0;
  for (WidthMax = 0; WidthMax < local_60; WidthMax = WidthMax + 1) {
    if (local_64 < piStack_20[WidthMax]) {
      local_64 = piStack_20[WidthMax];
    }
  }
  st__free_table(tNodes);
  return local_64;
}

Assistant:

int Extra_ProfileWidth( DdManager * dd, DdNode * Func, int * pProfile, int CutLevel )
{
    st__generator * gen;
    st__table * tNodeTopRef; // this table stores the top level from which this node is pointed to
    st__table * tNodes;
    DdNode * node;
    DdNode * nodeR;
    int LevelStart, Limit;
    int i, size;
    int WidthMax;
  
    // start the mapping table
    tNodeTopRef = st__init_table( st__ptrcmp, st__ptrhash);;
    // add the topmost node to the profile
    extraProfileUpdateTopLevel( tNodeTopRef, 0, Func );

    // collect all nodes
    tNodes = Extra_CollectNodes( Func );
    // go though all the nodes and set the top level the cofactors are pointed from
//  Cudd_ForeachNode( dd, Func, genDD, node )
    st__foreach_item( tNodes, gen, (const char**)&node, NULL )
    {
//      assert( Cudd_Regular(node) );  // this procedure works only with ADD/ZDD (not BDD w/ compl.edges)
        nodeR = Cudd_Regular(node);
        if ( cuddIsConstant(nodeR) )
            continue;
        // this node is not a constant - consider its cofactors
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddE(nodeR) );
        extraProfileUpdateTopLevel( tNodeTopRef, dd->perm[node->index]+1, cuddT(nodeR) );
    }
    st__free_table( tNodes );

    // clean the profile
    size = ddMax(dd->size, dd->sizeZ) + 1;
    for ( i = 0; i < size; i++ ) 
        pProfile[i] = 0;

    // create the profile
    st__foreach_item( tNodeTopRef, gen, (const char**)&node, (char**)&LevelStart )
    {
        nodeR = Cudd_Regular(node);
        Limit = (cuddIsConstant(nodeR))? dd->size: dd->perm[nodeR->index];
        for ( i = LevelStart; i <= Limit; i++ )
            pProfile[i]++;
    }

    if ( CutLevel != -1 && CutLevel != 0  )
        size = CutLevel;

    // get the max width
    WidthMax = 0;
    for ( i = 0; i < size; i++ ) 
        if ( WidthMax < pProfile[i] )
            WidthMax = pProfile[i];

    // deref the table
    st__free_table( tNodeTopRef );

    return WidthMax;
}